

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O0

BrotliDecoderErrorCode
duckdb_brotli::CopyUncompressedBlockToOutput
          (size_t *available_out,uint8_t **next_out,size_t *total_out,BrotliDecoderStateInternal *s)

{
  int iVar1;
  BrotliDecoderErrorCode BVar2;
  size_t *in_RCX;
  ulong *puVar3;
  uint8_t **in_RDX;
  size_t *in_RSI;
  BrotliDecoderStateInternal *in_RDI;
  BrotliDecoderErrorCode result;
  int nbytes;
  size_t avail_in;
  BrotliDecoderStateInternal *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff5c;
  size_t *psVar4;
  int local_68;
  size_t local_50;
  undefined1 *local_40;
  
  iVar1 = BrotliEnsureRingBuffer(in_stack_ffffffffffffff48);
  local_68 = in_stack_ffffffffffffff5c;
  if (iVar1 == 0) {
    return BROTLI_DECODER_ERROR_ALLOC_RING_BUFFER_1;
  }
LAB_00830739:
  psVar4 = in_RCX;
  if (*(int *)((long)in_RCX + 0x2f4) != 0) goto LAB_0083074e;
  if (in_RCX[5] - in_RCX[3] < 0x40000001) {
    local_68 = (int)(in_RCX[5] - in_RCX[3]) + (int)(in_RCX[2] >> 3);
  }
  else {
    local_68 = 0x40000000;
  }
  if (*(int *)((long)in_RCX + 0x84) < local_68) {
    local_68 = *(int *)((long)in_RCX + 0x84);
  }
  if (*(int *)((long)in_RCX + 100) < (int)in_RCX[0xb] + local_68) {
    local_68 = *(int *)((long)in_RCX + 100) - (int)in_RCX[0xb];
  }
  local_40 = (undefined1 *)(in_RCX[0x11] + (long)(int)in_RCX[0xb]);
  puVar3 = in_RCX + 1;
  for (local_50 = (size_t)local_68; 7 < in_RCX[2] && local_50 != 0; local_50 = local_50 - 1) {
    *local_40 = (char)*puVar3;
    in_RCX[2] = in_RCX[2] - 8;
    *puVar3 = *puVar3 >> 8;
    local_40 = local_40 + 1;
  }
  if (in_RCX[2] < 0x40) {
    *puVar3 = (1L << ((byte)in_RCX[2] & 0x3f)) - 1U & *puVar3;
  }
  if (local_50 != 0) {
    memcpy(local_40,(void *)in_RCX[3],local_50);
    in_RCX[3] = local_50 + in_RCX[3];
  }
  *(int *)(psVar4 + 0xb) = local_68 + (int)psVar4[0xb];
  *(int *)((long)psVar4 + 0x84) = *(int *)((long)psVar4 + 0x84) - local_68;
  if ((int)psVar4[0xb] < 1 << ((byte)(*(uint *)((long)psVar4 + 0x304) >> 6) & 0x1f)) {
    if (*(int *)((long)psVar4 + 0x84) == 0) {
      return BROTLI_DECODER_SUCCESS;
    }
    return BROTLI_DECODER_NEEDS_MORE_INPUT;
  }
  *(undefined4 *)((long)psVar4 + 0x2f4) = 1;
  goto LAB_00830a3c;
LAB_0083074e:
  if (*(int *)((long)in_RCX + 0x2f4) == 1) {
LAB_00830a3c:
    BVar2 = WriteRingBuffer(in_RDI,in_RSI,in_RDX,psVar4,local_68);
    if (BVar2 != BROTLI_DECODER_SUCCESS) {
      return BVar2;
    }
    if (*(int *)((long)psVar4 + 100) == 1 << ((byte)(*(uint *)((long)psVar4 + 0x304) >> 6) & 0x1f))
    {
      *(undefined4 *)(psVar4 + 0xc) = *(undefined4 *)((long)psVar4 + 0x5c);
    }
    *(undefined4 *)((long)psVar4 + 0x2f4) = 0;
    in_RCX = psVar4;
  }
  goto LAB_00830739;
}

Assistant:

static BrotliDecoderErrorCode BROTLI_NOINLINE CopyUncompressedBlockToOutput(size_t *available_out, uint8_t **next_out,
                                                                            size_t *total_out, BrotliDecoderState *s) {
	/* TODO(eustas): avoid allocation for single uncompressed block. */
	if (!BrotliEnsureRingBuffer(s)) {
		return BROTLI_FAILURE(BROTLI_DECODER_ERROR_ALLOC_RING_BUFFER_1);
	}

	/* State machine */
	for (;;) {
		switch (s->substate_uncompressed) {
		case BROTLI_STATE_UNCOMPRESSED_NONE: {
			int nbytes = (int)BrotliGetRemainingBytes(&s->br);
			if (nbytes > s->meta_block_remaining_len) {
				nbytes = s->meta_block_remaining_len;
			}
			if (s->pos + nbytes > s->ringbuffer_size) {
				nbytes = s->ringbuffer_size - s->pos;
			}
			/* Copy remaining bytes from s->br.buf_ to ring-buffer. */
			BrotliCopyBytes(&s->ringbuffer[s->pos], &s->br, (size_t)nbytes);
			s->pos += nbytes;
			s->meta_block_remaining_len -= nbytes;
			if (s->pos < 1 << s->window_bits) {
				if (s->meta_block_remaining_len == 0) {
					return BROTLI_DECODER_SUCCESS;
				}
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_WRITE;
		}
			/* Fall through. */

		case BROTLI_STATE_UNCOMPRESSED_WRITE: {
			BrotliDecoderErrorCode result;
			result = WriteRingBuffer(s, available_out, next_out, total_out, BROTLI_FALSE);
			if (result != BROTLI_DECODER_SUCCESS) {
				return result;
			}
			if (s->ringbuffer_size == 1 << s->window_bits) {
				s->max_distance = s->max_backward_distance;
			}
			s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_NONE;
			break;
		}
		}
	}
	BROTLI_DCHECK(0); /* Unreachable */
}